

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_factory.cpp
# Opt level: O2

shared_ptr<IGraphicsPlugin>
CreateGraphicsPlugin(shared_ptr<Options> *options,shared_ptr<IPlatformPlugin> *platformPlugin)

{
  key_type *__k;
  iterator iVar1;
  invalid_argument *piVar2;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<IGraphicsPlugin> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  string local_48;
  
  __k = (key_type *)
        (platformPlugin->super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (__k->_M_string_length == 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"No graphics API specified");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>,_IgnoreCaseStringLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>_>_>_>
                  *)(anonymous_namespace)::graphicsPluginMap_abi_cxx11_,__k);
  if (iVar1._M_node != (_Base_ptr)((anonymous_namespace)::graphicsPluginMap_abi_cxx11_ + 8)) {
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    in_RDX[1] = 0;
    *in_RDX = 0;
    std::
    function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>
    ::operator()((function<std::shared_ptr<IGraphicsPlugin>_(const_std::shared_ptr<Options>_&,_std::shared_ptr<IPlatformPlugin>)>
                  *)options,(shared_ptr<Options> *)(iVar1._M_node + 2),platformPlugin);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    sVar3.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)options;
    return (shared_ptr<IGraphicsPlugin>)
           sVar3.super___shared_ptr<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  Fmt_abi_cxx11_(&local_48,"Unsupported graphics API \'%s\'",
                 ((platformPlugin->super___shared_ptr<IPlatformPlugin,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->_vptr_IPlatformPlugin);
  std::invalid_argument::invalid_argument(piVar2,(string *)&local_48);
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<IGraphicsPlugin> CreateGraphicsPlugin(const std::shared_ptr<Options>& options,
                                                      std::shared_ptr<IPlatformPlugin> platformPlugin) {
    if (options->GraphicsPlugin.empty()) {
        throw std::invalid_argument("No graphics API specified");
    }

    const auto apiIt = graphicsPluginMap.find(options->GraphicsPlugin);
    if (apiIt == graphicsPluginMap.end()) {
        throw std::invalid_argument(Fmt("Unsupported graphics API '%s'", options->GraphicsPlugin.c_str()));
    }

    return apiIt->second(options, std::move(platformPlugin));
}